

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv_udp_set_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,uv_membership membership)

{
  int iVar1;
  int *piVar2;
  sockaddr_in6 *addr;
  sockaddr_in addr4;
  sockaddr_in6 addr6;
  sockaddr_in6 local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  uint32_t local_58;
  sockaddr_in local_4c;
  sockaddr_in6 local_3c;
  
  iVar1 = uv_ip4_addr(multicast_addr,0,&local_4c);
  if (iVar1 == 0) {
    if ((handle->io_watcher).fd == -1) {
      local_88.sin6_addr.__in6_u.__u6_addr32[0] = 0;
      local_88.sin6_addr.__in6_u.__u6_addr32[1] = 0;
      local_88.sin6_family = 2;
      local_88.sin6_port = 0;
      local_88.sin6_flowinfo = 0;
      iVar1 = uv__udp_bind(handle,(sockaddr *)&local_88,0x10,4);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_88.sin6_family = 0;
    local_88.sin6_port = 0;
    local_88.sin6_flowinfo = 0;
    if (interface_addr == (char *)0x0) {
      local_88.sin6_family = 0;
      local_88.sin6_port = 0;
      local_88.sin6_flowinfo = 0;
    }
    else {
      iVar1 = uv_inet_pton(2,interface_addr,&local_88.sin6_flowinfo);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_88._0_4_ = local_4c.sin_addr.s_addr;
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x23;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x24;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0,iVar1,&local_88,8);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = uv_ip6_addr(multicast_addr,0,&local_3c);
    if (iVar1 != 0) {
      return -0x16;
    }
    if ((handle->io_watcher).fd == -1) {
      local_88.sin6_scope_id = 0;
      local_88.sin6_family = 10;
      local_88.sin6_port = 0;
      local_88.sin6_flowinfo = 0;
      local_88.sin6_addr.__in6_u.__u6_addr32[0] = (uint32_t)_in6addr_any;
      local_88.sin6_addr.__in6_u.__u6_addr32[1] = (uint32_t)((ulong)_in6addr_any >> 0x20);
      local_88.sin6_addr.__in6_u.__u6_addr32[2] = (uint32_t)__Rb_tree_increment;
      local_88.sin6_addr.__in6_u.__u6_addr32[3] = (uint32_t)((ulong)__Rb_tree_increment >> 0x20);
      iVar1 = uv__udp_bind(handle,(sockaddr *)&local_88,0x1c,4);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_58 = 0;
    if (interface_addr != (char *)0x0) {
      iVar1 = uv_ip6_addr(interface_addr,0,&local_88);
      if (iVar1 != 0) {
        return -0x16;
      }
      local_58 = local_88.sin6_scope_id;
    }
    local_68 = local_3c.sin6_addr.__in6_u._0_8_;
    uStack_60 = local_3c.sin6_addr.__in6_u._8_8_;
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x14;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x15;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,iVar1,&local_68,0x14);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv_udp_set_membership(uv_udp_t* handle,
                          const char* multicast_addr,
                          const char* interface_addr,
                          uv_membership membership) {
  int err;
  struct sockaddr_in addr4;
  struct sockaddr_in6 addr6;

  if (uv_ip4_addr(multicast_addr, 0, &addr4) == 0) {
    err = uv__udp_maybe_deferred_bind(handle, AF_INET, UV_UDP_REUSEADDR);
    if (err)
      return err;
    return uv__udp_set_membership4(handle, &addr4, interface_addr, membership);
  } else if (uv_ip6_addr(multicast_addr, 0, &addr6) == 0) {
    err = uv__udp_maybe_deferred_bind(handle, AF_INET6, UV_UDP_REUSEADDR);
    if (err)
      return err;
    return uv__udp_set_membership6(handle, &addr6, interface_addr, membership);
  } else {
    return UV_EINVAL;
  }
}